

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient3dadapt(double *pa,double *pb,double *pc,double *pd,double permanent)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int flen;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double b;
  double b_00;
  double b_01;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double b_02;
  double b_03;
  double b_04;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double _0;
  double _k;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double negate;
  int wlength;
  int vlength;
  double u3;
  double w [16];
  double v [12];
  double u [4];
  double bdxt_adyt0;
  double adxt_bdyt0;
  double adxt_cdyt0;
  double cdxt_adyt0;
  double cdxt_bdyt0;
  double bdxt_cdyt0;
  double bdxt_adyt1;
  double adxt_bdyt1;
  double adxt_cdyt1;
  double cdxt_adyt1;
  double cdxt_bdyt1;
  double bdxt_cdyt1;
  int abtlen;
  int catlen;
  int bctlen;
  double abt [8];
  double cat [8];
  double bct [8];
  double bdyt_adx0;
  double adyt_bdx0;
  double adyt_cdx0;
  double cdyt_adx0;
  double cdyt_bdx0;
  double bdyt_cdx0;
  double bdyt_adx1;
  double adyt_bdx1;
  double adyt_cdx1;
  double cdyt_adx1;
  double cdyt_bdx1;
  double bdyt_cdx1;
  double bdxt_ady0;
  double adxt_bdy0;
  double adxt_cdy0;
  double cdxt_ady0;
  double cdxt_bdy0;
  double bdxt_cdy0;
  double bdxt_ady1;
  double adxt_bdy1;
  double adxt_cdy1;
  double cdxt_ady1;
  double cdxt_bdy1;
  double bdxt_cdy1;
  int ct_blen;
  int ct_alen;
  int bt_alen;
  int bt_clen;
  int at_clen;
  int at_blen;
  double ct_b [4];
  double ct_a [4];
  double bt_a [4];
  double bt_c [4];
  double at_c [4];
  double at_b [4];
  double ct_blarge;
  double ct_alarge;
  double bt_alarge;
  double bt_clarge;
  double at_clarge;
  double at_blarge;
  double cdztail;
  double bdztail;
  double adztail;
  double cdytail;
  double bdytail;
  double adytail;
  double cdxtail;
  double bdxtail;
  double adxtail;
  int finlength;
  double fin2 [192];
  double fin1 [192];
  double *finswap;
  double *finother;
  double *finnow;
  int ablen;
  double abdet [16];
  int clen;
  int blen;
  int alen;
  double cdet [8];
  double bdet [8];
  double adet [8];
  double ab3;
  double ca3;
  double bc3;
  double ab [4];
  double ca [4];
  double bc [4];
  double bdxady0;
  double adxbdy0;
  double adxcdy0;
  double cdxady0;
  double cdxbdy0;
  double bdxcdy0;
  double bdxady1;
  double adxbdy1;
  double adxcdy1;
  double cdxady1;
  double cdxbdy1;
  double bdxcdy1;
  double errbound;
  double det;
  double cdz;
  double bdz;
  double adz;
  double cdy;
  double bdy;
  double ady;
  double cdx;
  double bdx;
  double adx;
  double permanent_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar7 = *pa - *pd;
  dVar8 = *pb - *pd;
  dVar9 = *pc - *pd;
  dVar10 = pa[1] - pd[1];
  dVar11 = pb[1] - pd[1];
  dVar12 = pc[1] - pd[1];
  b = pa[2] - pd[2];
  b_00 = pb[2] - pd[2];
  b_01 = pc[2] - pd[2];
  dVar13 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar14 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar13 = (dVar8 - dVar13) * (dVar12 - dVar14) +
           -(-dVar13 * (dVar12 - dVar14) +
            -(dVar8 - dVar13) * dVar14 + -dVar13 * dVar14 + dVar8 * dVar12);
  dVar14 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar15 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar14 = (dVar9 - dVar14) * (dVar11 - dVar15) +
           -(-dVar14 * (dVar11 - dVar15) +
            -(dVar9 - dVar14) * dVar15 + -dVar14 * dVar15 + dVar9 * dVar11);
  dVar15 = dVar13 - dVar14;
  dVar16 = dVar13 - dVar15;
  ca[3] = (dVar13 - (dVar15 + dVar16)) + (dVar16 - dVar14);
  iVar3 = scale_expansion_zeroelim(4,ca + 3,b,bdet + 7);
  dVar13 = dVar9 * dVar10;
  dVar14 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar15 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar14 = (dVar9 - dVar14) * (dVar10 - dVar15) +
           -(-dVar14 * (dVar10 - dVar15) + -(dVar9 - dVar14) * dVar15 + -dVar14 * dVar15 + dVar13);
  dVar15 = dVar7 * dVar12;
  dVar16 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar17 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar16 = (dVar7 - dVar16) * (dVar12 - dVar17) +
           -(-dVar16 * (dVar12 - dVar17) + -(dVar7 - dVar16) * dVar17 + -dVar16 * dVar17 + dVar15);
  dVar17 = dVar14 - dVar16;
  ab[3] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  dVar14 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar17 - (dVar14 - dVar13));
  dVar16 = dVar13 - dVar15;
  ca[0] = (dVar13 - (dVar16 + (dVar13 - dVar16))) + ((dVar13 - dVar16) - dVar15);
  ca[2] = dVar14 + dVar16;
  ca[1] = (dVar14 - (ca[2] - (ca[2] - dVar14))) + (dVar16 - (ca[2] - dVar14));
  iVar4 = scale_expansion_zeroelim(4,ab + 3,b_00,cdet + 7);
  dVar13 = dVar7 * dVar11;
  dVar14 = splitter * dVar7 - (splitter * dVar7 - dVar7);
  dVar15 = splitter * dVar11 - (splitter * dVar11 - dVar11);
  dVar14 = (dVar7 - dVar14) * (dVar11 - dVar15) +
           -(-dVar14 * (dVar11 - dVar15) + -(dVar7 - dVar14) * dVar15 + -dVar14 * dVar15 + dVar13);
  dVar15 = dVar8 * dVar10;
  dVar16 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar17 = splitter * dVar10 - (splitter * dVar10 - dVar10);
  dVar16 = (dVar8 - dVar16) * (dVar10 - dVar17) +
           -(-dVar16 * (dVar10 - dVar17) + -(dVar8 - dVar16) * dVar17 + -dVar16 * dVar17 + dVar15);
  dVar17 = dVar14 - dVar16;
  bc3 = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  dVar14 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar17 - (dVar14 - dVar13));
  dVar16 = dVar13 - dVar15;
  ab[0] = (dVar13 - (dVar16 + (dVar13 - dVar16))) + ((dVar13 - dVar16) - dVar15);
  ab[2] = dVar14 + dVar16;
  ab[1] = (dVar14 - (ab[2] - (ab[2] - dVar14))) + (dVar16 - (ab[2] - dVar14));
  abdet[0xf]._4_4_ = scale_expansion_zeroelim(4,&bc3,b_01,(double *)&blen);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar3,bdet + 7,iVar4,cdet + 7,(double *)&stack0xfffffffffffffd38);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar3,(double *)&stack0xfffffffffffffd38,abdet[0xf]._4_4_,(double *)&blen,
                     fin2 + 0xbf);
  pa_local = (double *)estimate(iVar3,fin2 + 0xbf);
  if (((double)pa_local < o3derrboundB * permanent) &&
     (-(double)pa_local < o3derrboundB * permanent)) {
    dVar13 = (*pa - (dVar7 + (*pa - dVar7))) + ((*pa - dVar7) - *pd);
    dVar14 = (*pb - (dVar8 + (*pb - dVar8))) + ((*pb - dVar8) - *pd);
    dVar15 = (*pc - (dVar9 + (*pc - dVar9))) + ((*pc - dVar9) - *pd);
    dVar16 = (pa[1] - (dVar10 + (pa[1] - dVar10))) + ((pa[1] - dVar10) - pd[1]);
    dVar17 = (pb[1] - (dVar11 + (pb[1] - dVar11))) + ((pb[1] - dVar11) - pd[1]);
    dVar18 = (pc[1] - (dVar12 + (pc[1] - dVar12))) + ((pc[1] - dVar12) - pd[1]);
    b_02 = (pa[2] - (b + (pa[2] - b))) + ((pa[2] - b) - pd[2]);
    b_03 = (pb[2] - (b_00 + (pb[2] - b_00))) + ((pb[2] - b_00) - pd[2]);
    b_04 = (pc[2] - (b_01 + (pc[2] - b_01))) + ((pc[2] - b_01) - pd[2]);
    if (((((dVar13 != 0.0) ||
          ((((NAN(dVar13) || (dVar14 != 0.0)) || (NAN(dVar14))) ||
           ((dVar15 != 0.0 || (NAN(dVar15))))))) || (dVar16 != 0.0)) ||
        ((((NAN(dVar16) || (dVar17 != 0.0)) ||
          ((NAN(dVar17) || (((dVar18 != 0.0 || (NAN(dVar18))) || (b_02 != 0.0)))))) ||
         ((NAN(b_02) || (b_03 != 0.0)))))) || ((NAN(b_03) || ((b_04 != 0.0 || (NAN(b_04))))))) {
      dVar19 = o3derrboundC * permanent + resulterrbound * ABS((double)pa_local);
      pa_local = (double *)
                 (b * ((dVar8 * dVar18 + dVar12 * dVar14) - (dVar11 * dVar15 + dVar9 * dVar17)) +
                  b_02 * (dVar8 * dVar12 + -(dVar11 * dVar9)) +
                  b_00 * ((dVar9 * dVar16 + dVar10 * dVar15) - (dVar12 * dVar13 + dVar7 * dVar18)) +
                  b_03 * (dVar9 * dVar10 + -(dVar12 * dVar7)) +
                  b_01 * ((dVar7 * dVar17 + dVar11 * dVar13) - (dVar10 * dVar14 + dVar8 * dVar16)) +
                  b_04 * (dVar7 * dVar11 + -(dVar10 * dVar8)) + (double)pa_local);
      if (((double)pa_local < dVar19) && (-(double)pa_local < dVar19)) {
        pdVar1 = fin2 + 0xbf;
        finother = (double *)&stack0xfffffffffffff118;
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            dVar19 = splitter * dVar13 - (splitter * dVar13 - dVar13);
            dVar23 = splitter * dVar11 - (splitter * dVar11 - dVar11);
            dVar19 = (dVar13 - dVar19) * (dVar11 - dVar23) +
                     -(-dVar19 * (dVar11 - dVar23) +
                      -(dVar13 - dVar19) * dVar23 + -dVar19 * dVar23 + dVar13 * dVar11);
            dVar23 = splitter * dVar16 - (splitter * dVar16 - dVar16);
            dVar21 = splitter * dVar8 - (splitter * dVar8 - dVar8);
            dVar23 = (dVar16 - dVar23) * (dVar8 - dVar21) +
                     -(-dVar23 * (dVar8 - dVar21) +
                      -(dVar16 - dVar23) * dVar21 + -dVar23 * dVar21 + dVar16 * dVar8);
            dVar21 = dVar19 - dVar23;
            dVar22 = dVar19 - dVar21;
            at_c[3] = (dVar19 - (dVar21 + dVar22)) + (dVar22 - dVar23);
            bt_clen = 4;
            dVar19 = dVar16 * dVar9;
            dVar23 = splitter * dVar16 - (splitter * dVar16 - dVar16);
            dVar21 = splitter * dVar9 - (splitter * dVar9 - dVar9);
            dVar23 = (dVar16 - dVar23) * (dVar9 - dVar21) +
                     -(-dVar23 * (dVar9 - dVar21) +
                      -(dVar16 - dVar23) * dVar21 + -dVar23 * dVar21 + dVar19);
            dVar21 = dVar13 * dVar12;
            dVar22 = splitter * dVar13 - (splitter * dVar13 - dVar13);
            dVar20 = splitter * dVar12 - (splitter * dVar12 - dVar12);
            dVar22 = (dVar13 - dVar22) * (dVar12 - dVar20) +
                     -(-dVar22 * (dVar12 - dVar20) +
                      -(dVar13 - dVar22) * dVar20 + -dVar22 * dVar20 + dVar21);
            dVar20 = dVar23 - dVar22;
            bt_c[3] = (dVar23 - (dVar20 + (dVar23 - dVar20))) + ((dVar23 - dVar20) - dVar22);
            dVar23 = dVar19 + dVar20;
            dVar19 = (dVar19 - (dVar23 - (dVar23 - dVar19))) + (dVar20 - (dVar23 - dVar19));
            dVar22 = dVar19 - dVar21;
            at_c[0] = (dVar19 - (dVar22 + (dVar19 - dVar22))) + ((dVar19 - dVar22) - dVar21);
            at_c[2] = dVar23 + dVar22;
            at_c[1] = (dVar23 - (at_c[2] - (at_c[2] - dVar23))) + (dVar22 - (at_c[2] - dVar23));
            bt_alen = 4;
          }
          else {
            dVar19 = splitter * dVar13 - (splitter * dVar13 - dVar13);
            dVar23 = splitter * dVar11 - (splitter * dVar11 - dVar11);
            at_c[3] = (dVar13 - dVar19) * (dVar11 - dVar23) +
                      -(-dVar19 * (dVar11 - dVar23) +
                       -(dVar13 - dVar19) * dVar23 + -dVar19 * dVar23 + dVar13 * dVar11);
            bt_clen = 2;
            dVar19 = -dVar13;
            at_c[0] = dVar19 * dVar12;
            dVar23 = splitter * dVar19 - (splitter * dVar19 - dVar19);
            dVar21 = splitter * dVar12 - (splitter * dVar12 - dVar12);
            bt_c[3] = (dVar19 - dVar23) * (dVar12 - dVar21) +
                      -(-dVar23 * (dVar12 - dVar21) +
                       -(dVar19 - dVar23) * dVar21 + -dVar23 * dVar21 + at_c[0]);
            bt_alen = 2;
          }
        }
        else if ((dVar16 != 0.0) || (NAN(dVar16))) {
          dVar19 = -dVar16;
          dVar23 = splitter * dVar19 - (splitter * dVar19 - dVar19);
          dVar21 = splitter * dVar8 - (splitter * dVar8 - dVar8);
          at_c[3] = (dVar19 - dVar23) * (dVar8 - dVar21) +
                    -(-dVar23 * (dVar8 - dVar21) +
                     -(dVar19 - dVar23) * dVar21 + -dVar23 * dVar21 + dVar19 * dVar8);
          bt_clen = 2;
          at_c[0] = dVar16 * dVar9;
          dVar19 = splitter * dVar16 - (splitter * dVar16 - dVar16);
          dVar23 = splitter * dVar9 - (splitter * dVar9 - dVar9);
          bt_c[3] = (dVar16 - dVar19) * (dVar9 - dVar23) +
                    -(-dVar19 * (dVar9 - dVar23) +
                     -(dVar16 - dVar19) * dVar23 + -dVar19 * dVar23 + at_c[0]);
          bt_alen = 2;
        }
        else {
          at_c[3] = 0.0;
          bt_clen = 1;
          bt_c[3] = 0.0;
          bt_alen = 1;
        }
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            dVar19 = dVar14 * dVar12;
            dVar23 = splitter * dVar14 - (splitter * dVar14 - dVar14);
            dVar21 = splitter * dVar12 - (splitter * dVar12 - dVar12);
            dVar12 = (dVar14 - dVar23) * (dVar12 - dVar21) +
                     -(-dVar23 * (dVar12 - dVar21) +
                      -(dVar14 - dVar23) * dVar21 + -dVar23 * dVar21 + dVar19);
            dVar23 = dVar17 * dVar9;
            dVar21 = splitter * dVar17 - (splitter * dVar17 - dVar17);
            dVar22 = splitter * dVar9 - (splitter * dVar9 - dVar9);
            dVar9 = (dVar17 - dVar21) * (dVar9 - dVar22) +
                    -(-dVar21 * (dVar9 - dVar22) +
                     -(dVar17 - dVar21) * dVar22 + -dVar21 * dVar22 + dVar23);
            dVar21 = dVar12 - dVar9;
            bt_a[3] = (dVar12 - (dVar21 + (dVar12 - dVar21))) + ((dVar12 - dVar21) - dVar9);
            dVar9 = dVar19 + dVar21;
            dVar12 = (dVar19 - (dVar9 - (dVar9 - dVar19))) + (dVar21 - (dVar9 - dVar19));
            dVar19 = dVar12 - dVar23;
            bt_c[0] = (dVar12 - (dVar19 + (dVar12 - dVar19))) + ((dVar12 - dVar19) - dVar23);
            bt_c[2] = dVar9 + dVar19;
            bt_c[1] = (dVar9 - (bt_c[2] - (bt_c[2] - dVar9))) + (dVar19 - (bt_c[2] - dVar9));
            ct_alen = 4;
            dVar9 = dVar17 * dVar7;
            dVar12 = splitter * dVar17 - (splitter * dVar17 - dVar17);
            dVar19 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            dVar12 = (dVar17 - dVar12) * (dVar7 - dVar19) +
                     -(-dVar12 * (dVar7 - dVar19) +
                      -(dVar17 - dVar12) * dVar19 + -dVar12 * dVar19 + dVar9);
            dVar19 = dVar14 * dVar10;
            dVar23 = splitter * dVar14 - (splitter * dVar14 - dVar14);
            dVar21 = splitter * dVar10 - (splitter * dVar10 - dVar10);
            dVar23 = (dVar14 - dVar23) * (dVar10 - dVar21) +
                     -(-dVar23 * (dVar10 - dVar21) +
                      -(dVar14 - dVar23) * dVar21 + -dVar23 * dVar21 + dVar19);
            dVar21 = dVar12 - dVar23;
            ct_a[3] = (dVar12 - (dVar21 + (dVar12 - dVar21))) + ((dVar12 - dVar21) - dVar23);
            dVar12 = dVar9 + dVar21;
            dVar9 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar21 - (dVar12 - dVar9));
            dVar23 = dVar9 - dVar19;
            bt_a[0] = (dVar9 - (dVar23 + (dVar9 - dVar23))) + ((dVar9 - dVar23) - dVar19);
            bt_a[2] = dVar12 + dVar23;
            bt_a[1] = (dVar12 - (bt_a[2] - (bt_a[2] - dVar12))) + (dVar23 - (bt_a[2] - dVar12));
            ct_blen = 4;
          }
          else {
            bt_c[0] = dVar14 * dVar12;
            dVar9 = splitter * dVar14 - (splitter * dVar14 - dVar14);
            dVar19 = splitter * dVar12 - (splitter * dVar12 - dVar12);
            bt_a[3] = (dVar14 - dVar9) * (dVar12 - dVar19) +
                      -(-dVar9 * (dVar12 - dVar19) +
                       -(dVar14 - dVar9) * dVar19 + -dVar9 * dVar19 + bt_c[0]);
            ct_alen = 2;
            dVar9 = -dVar14;
            bt_a[0] = dVar9 * dVar10;
            dVar12 = splitter * dVar9 - (splitter * dVar9 - dVar9);
            dVar19 = splitter * dVar10 - (splitter * dVar10 - dVar10);
            ct_a[3] = (dVar9 - dVar12) * (dVar10 - dVar19) +
                      -(-dVar12 * (dVar10 - dVar19) +
                       -(dVar9 - dVar12) * dVar19 + -dVar12 * dVar19 + bt_a[0]);
            ct_blen = 2;
          }
        }
        else if ((dVar17 != 0.0) || (NAN(dVar17))) {
          dVar12 = -dVar17;
          bt_c[0] = dVar12 * dVar9;
          dVar19 = splitter * dVar12 - (splitter * dVar12 - dVar12);
          dVar23 = splitter * dVar9 - (splitter * dVar9 - dVar9);
          bt_a[3] = (dVar12 - dVar19) * (dVar9 - dVar23) +
                    -(-dVar19 * (dVar9 - dVar23) +
                     -(dVar12 - dVar19) * dVar23 + -dVar19 * dVar23 + bt_c[0]);
          ct_alen = 2;
          bt_a[0] = dVar17 * dVar7;
          dVar9 = splitter * dVar17 - (splitter * dVar17 - dVar17);
          dVar12 = splitter * dVar7 - (splitter * dVar7 - dVar7);
          ct_a[3] = (dVar17 - dVar9) * (dVar7 - dVar12) +
                    -(-dVar9 * (dVar7 - dVar12) +
                     -(dVar17 - dVar9) * dVar12 + -dVar9 * dVar12 + bt_a[0]);
          ct_blen = 2;
        }
        else {
          bt_a[3] = 0.0;
          ct_alen = 1;
          ct_a[3] = 0.0;
          ct_blen = 1;
        }
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          if ((dVar18 != 0.0) || (NAN(dVar18))) {
            dVar9 = dVar15 * dVar10;
            dVar12 = splitter * dVar15 - (splitter * dVar15 - dVar15);
            dVar19 = splitter * dVar10 - (splitter * dVar10 - dVar10);
            dVar10 = (dVar15 - dVar12) * (dVar10 - dVar19) +
                     -(-dVar12 * (dVar10 - dVar19) +
                      -(dVar15 - dVar12) * dVar19 + -dVar12 * dVar19 + dVar9);
            dVar12 = dVar18 * dVar7;
            dVar19 = splitter * dVar18 - (splitter * dVar18 - dVar18);
            dVar23 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            dVar7 = (dVar18 - dVar19) * (dVar7 - dVar23) +
                    -(-dVar19 * (dVar7 - dVar23) +
                     -(dVar18 - dVar19) * dVar23 + -dVar19 * dVar23 + dVar12);
            dVar19 = dVar10 - dVar7;
            ct_b[3] = (dVar10 - (dVar19 + (dVar10 - dVar19))) + ((dVar10 - dVar19) - dVar7);
            dVar7 = dVar9 + dVar19;
            dVar9 = (dVar9 - (dVar7 - (dVar7 - dVar9))) + (dVar19 - (dVar7 - dVar9));
            dVar10 = dVar9 - dVar12;
            ct_a[0] = (dVar9 - (dVar10 + (dVar9 - dVar10))) + ((dVar9 - dVar10) - dVar12);
            ct_a[2] = dVar7 + dVar10;
            ct_a[1] = (dVar7 - (ct_a[2] - (ct_a[2] - dVar7))) + (dVar10 - (ct_a[2] - dVar7));
            bdxt_cdy1._4_4_ = 4;
            dVar7 = dVar18 * dVar8;
            dVar9 = splitter * dVar18 - (splitter * dVar18 - dVar18);
            dVar10 = splitter * dVar8 - (splitter * dVar8 - dVar8);
            dVar8 = (dVar18 - dVar9) * (dVar8 - dVar10) +
                    -(-dVar9 * (dVar8 - dVar10) +
                     -(dVar18 - dVar9) * dVar10 + -dVar9 * dVar10 + dVar7);
            dVar9 = dVar15 * dVar11;
            dVar10 = splitter * dVar15 - (splitter * dVar15 - dVar15);
            dVar12 = splitter * dVar11 - (splitter * dVar11 - dVar11);
            dVar10 = (dVar15 - dVar10) * (dVar11 - dVar12) +
                     -(-dVar10 * (dVar11 - dVar12) +
                      -(dVar15 - dVar10) * dVar12 + -dVar10 * dVar12 + dVar9);
            dVar11 = dVar8 - dVar10;
            _at_clen = (dVar8 - (dVar11 + (dVar8 - dVar11))) + ((dVar8 - dVar11) - dVar10);
            dVar8 = dVar7 + dVar11;
            dVar7 = (dVar7 - (dVar8 - (dVar8 - dVar7))) + (dVar11 - (dVar8 - dVar7));
            dVar10 = dVar7 - dVar9;
            ct_b[0] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
            ct_b[2] = dVar8 + dVar10;
            ct_b[1] = (dVar8 - (ct_b[2] - (ct_b[2] - dVar8))) + (dVar10 - (ct_b[2] - dVar8));
            bdxt_cdy1._0_4_ = 4;
          }
          else {
            ct_a[0] = dVar15 * dVar10;
            dVar7 = splitter * dVar15 - (splitter * dVar15 - dVar15);
            dVar8 = splitter * dVar10 - (splitter * dVar10 - dVar10);
            ct_b[3] = (dVar15 - dVar7) * (dVar10 - dVar8) +
                      -(-dVar7 * (dVar10 - dVar8) +
                       -(dVar15 - dVar7) * dVar8 + -dVar7 * dVar8 + ct_a[0]);
            bdxt_cdy1._4_4_ = 2;
            dVar7 = -dVar15;
            ct_b[0] = dVar7 * dVar11;
            dVar8 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            dVar9 = splitter * dVar11 - (splitter * dVar11 - dVar11);
            _at_clen = (dVar7 - dVar8) * (dVar11 - dVar9) +
                       -(-dVar8 * (dVar11 - dVar9) +
                        -(dVar7 - dVar8) * dVar9 + -dVar8 * dVar9 + ct_b[0]);
            bdxt_cdy1._0_4_ = 2;
          }
        }
        else if ((dVar18 != 0.0) || (NAN(dVar18))) {
          dVar9 = -dVar18;
          ct_a[0] = dVar9 * dVar7;
          dVar10 = splitter * dVar9 - (splitter * dVar9 - dVar9);
          dVar11 = splitter * dVar7 - (splitter * dVar7 - dVar7);
          ct_b[3] = (dVar9 - dVar10) * (dVar7 - dVar11) +
                    -(-dVar10 * (dVar7 - dVar11) +
                     -(dVar9 - dVar10) * dVar11 + -dVar10 * dVar11 + ct_a[0]);
          bdxt_cdy1._4_4_ = 2;
          ct_b[0] = dVar18 * dVar8;
          dVar7 = splitter * dVar18 - (splitter * dVar18 - dVar18);
          dVar9 = splitter * dVar8 - (splitter * dVar8 - dVar8);
          _at_clen = (dVar18 - dVar7) * (dVar8 - dVar9) +
                     -(-dVar7 * (dVar8 - dVar9) +
                      -(dVar18 - dVar7) * dVar9 + -dVar7 * dVar9 + ct_b[0]);
          bdxt_cdy1._0_4_ = 2;
        }
        else {
          ct_b[3] = 0.0;
          bdxt_cdy1._4_4_ = 1;
          _at_clen = 0.0;
          bdxt_cdy1._0_4_ = 1;
        }
        iVar4 = fast_expansion_sum_zeroelim
                          (ct_alen,bt_a + 3,bdxt_cdy1._0_4_,(double *)&at_clen,cat + 7);
        iVar5 = scale_expansion_zeroelim(iVar4,cat + 7,b,&u3);
        iVar3 = fast_expansion_sum_zeroelim(iVar3,pdVar1,iVar5,&u3,finother);
        iVar5 = fast_expansion_sum_zeroelim(bdxt_cdy1._4_4_,ct_b + 3,bt_alen,bt_c + 3,abt + 7);
        iVar6 = scale_expansion_zeroelim(iVar5,abt + 7,b_00,&u3);
        iVar3 = fast_expansion_sum_zeroelim(iVar3,finother,iVar6,&u3,pdVar1);
        iVar6 = fast_expansion_sum_zeroelim(bt_clen,at_c + 3,ct_blen,ct_a + 3,(double *)&catlen);
        flen = scale_expansion_zeroelim(iVar6,(double *)&catlen,b_01,&u3);
        adxtail._4_4_ = fast_expansion_sum_zeroelim(iVar3,pdVar1,flen,&u3,finother);
        if ((b_02 != 0.0) || (finswap = pdVar1, NAN(b_02))) {
          iVar3 = scale_expansion_zeroelim(4,ca + 3,b_02,w + 0xf);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,w + 0xf,pdVar1);
          finswap = finother;
          finother = pdVar1;
        }
        pdVar1 = finother;
        if ((b_03 != 0.0) || (NAN(b_03))) {
          iVar3 = scale_expansion_zeroelim(4,ab + 3,b_03,w + 0xf);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,w + 0xf,finswap);
          finother = finswap;
          finswap = pdVar1;
        }
        pdVar1 = finother;
        if ((b_04 != 0.0) || (NAN(b_04))) {
          iVar3 = scale_expansion_zeroelim(4,&bc3,b_04,w + 0xf);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,w + 0xf,finswap);
          finother = finswap;
          finswap = pdVar1;
        }
        pdVar2 = finother;
        pdVar1 = finswap;
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          if ((dVar17 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar17))) {
            dVar7 = splitter * dVar13 - (splitter * dVar13 - dVar13);
            dVar8 = splitter * dVar17 - (splitter * dVar17 - dVar17);
            dVar7 = (dVar13 - dVar7) * (dVar17 - dVar8) +
                    -(-dVar7 * (dVar17 - dVar8) +
                     -(dVar13 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar13 * dVar17);
            dVar8 = splitter * b_01 - (splitter * b_01 - b_01);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b_01 - dVar8) +
                     -(-dVar9 * (b_01 - dVar8) +
                      -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_01);
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_04 != 0.0) || (NAN(b_04))) {
              dVar8 = splitter * b_04 - (splitter * b_04 - b_04);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_04 - dVar8) +
                       -(-dVar9 * (b_04 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_04);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
          pdVar2 = finother;
          pdVar1 = finswap;
          if ((dVar18 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar18))) {
            dVar13 = -dVar13;
            dVar7 = splitter * dVar13 - (splitter * dVar13 - dVar13);
            dVar8 = splitter * dVar18 - (splitter * dVar18 - dVar18);
            dVar7 = (dVar13 - dVar7) * (dVar18 - dVar8) +
                    -(-dVar7 * (dVar18 - dVar8) +
                     -(dVar13 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar13 * dVar18);
            dVar8 = splitter * b_00 - (splitter * b_00 - b_00);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b_00 - dVar8) +
                     -(-dVar9 * (b_00 - dVar8) +
                      -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_00);
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_03 != 0.0) || (NAN(b_03))) {
              dVar8 = splitter * b_03 - (splitter * b_03 - b_03);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_03 - dVar8) +
                       -(-dVar9 * (b_03 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_03);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
        }
        pdVar2 = finother;
        pdVar1 = finswap;
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          if ((dVar18 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar18))) {
            dVar7 = splitter * dVar14 - (splitter * dVar14 - dVar14);
            dVar8 = splitter * dVar18 - (splitter * dVar18 - dVar18);
            dVar7 = (dVar14 - dVar7) * (dVar18 - dVar8) +
                    -(-dVar7 * (dVar18 - dVar8) +
                     -(dVar14 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar14 * dVar18);
            dVar8 = splitter * b - (splitter * b - b);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b - dVar8) +
                     -(-dVar9 * (b - dVar8) + -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b)
            ;
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_02 != 0.0) || (NAN(b_02))) {
              dVar8 = splitter * b_02 - (splitter * b_02 - b_02);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_02 - dVar8) +
                       -(-dVar9 * (b_02 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_02);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
          pdVar2 = finother;
          pdVar1 = finswap;
          if ((dVar16 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar16))) {
            dVar14 = -dVar14;
            dVar7 = splitter * dVar14 - (splitter * dVar14 - dVar14);
            dVar8 = splitter * dVar16 - (splitter * dVar16 - dVar16);
            dVar7 = (dVar14 - dVar7) * (dVar16 - dVar8) +
                    -(-dVar7 * (dVar16 - dVar8) +
                     -(dVar14 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar14 * dVar16);
            dVar8 = splitter * b_01 - (splitter * b_01 - b_01);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b_01 - dVar8) +
                     -(-dVar9 * (b_01 - dVar8) +
                      -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_01);
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_04 != 0.0) || (NAN(b_04))) {
              dVar8 = splitter * b_04 - (splitter * b_04 - b_04);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_04 - dVar8) +
                       -(-dVar9 * (b_04 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_04);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
        }
        pdVar2 = finother;
        pdVar1 = finswap;
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          if ((dVar16 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar16))) {
            dVar7 = splitter * dVar15 - (splitter * dVar15 - dVar15);
            dVar8 = splitter * dVar16 - (splitter * dVar16 - dVar16);
            dVar7 = (dVar15 - dVar7) * (dVar16 - dVar8) +
                    -(-dVar7 * (dVar16 - dVar8) +
                     -(dVar15 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar15 * dVar16);
            dVar8 = splitter * b_00 - (splitter * b_00 - b_00);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b_00 - dVar8) +
                     -(-dVar9 * (b_00 - dVar8) +
                      -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_00);
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_03 != 0.0) || (NAN(b_03))) {
              dVar8 = splitter * b_03 - (splitter * b_03 - b_03);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_03 - dVar8) +
                       -(-dVar9 * (b_03 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_03);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
          pdVar2 = finother;
          pdVar1 = finswap;
          if ((dVar17 != 0.0) || (finswap = pdVar1, finother = pdVar2, NAN(dVar17))) {
            dVar15 = -dVar15;
            dVar7 = splitter * dVar15 - (splitter * dVar15 - dVar15);
            dVar8 = splitter * dVar17 - (splitter * dVar17 - dVar17);
            dVar7 = (dVar15 - dVar7) * (dVar17 - dVar8) +
                    -(-dVar7 * (dVar17 - dVar8) +
                     -(dVar15 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar15 * dVar17);
            dVar8 = splitter * b - (splitter * b - b);
            dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
            v[0xb] = (dVar7 - dVar9) * (b - dVar8) +
                     -(-dVar9 * (b - dVar8) + -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b)
            ;
            adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,4,v + 0xb,finswap);
            finother = finswap;
            finswap = pdVar2;
            if ((b_02 != 0.0) || (NAN(b_02))) {
              dVar8 = splitter * b_02 - (splitter * b_02 - b_02);
              dVar9 = splitter * dVar7 - (splitter * dVar7 - dVar7);
              v[0xb] = (dVar7 - dVar9) * (b_02 - dVar8) +
                       -(-dVar9 * (b_02 - dVar8) +
                        -(dVar7 - dVar9) * dVar8 + -dVar9 * dVar8 + dVar7 * b_02);
              adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,pdVar1,4,v + 0xb,pdVar2);
              finswap = pdVar1;
              finother = pdVar2;
            }
          }
        }
        pdVar1 = finother;
        if ((b_02 != 0.0) || (NAN(b_02))) {
          iVar3 = scale_expansion_zeroelim(iVar4,cat + 7,b_02,&u3);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,&u3,finswap);
          finother = finswap;
          finswap = pdVar1;
        }
        pdVar1 = finother;
        if ((b_03 != 0.0) || (NAN(b_03))) {
          iVar3 = scale_expansion_zeroelim(iVar5,abt + 7,b_03,&u3);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,&u3,finswap);
          finother = finswap;
          finswap = pdVar1;
        }
        if ((b_04 != 0.0) || (NAN(b_04))) {
          iVar3 = scale_expansion_zeroelim(iVar6,(double *)&catlen,b_04,&u3);
          adxtail._4_4_ = fast_expansion_sum_zeroelim(adxtail._4_4_,finother,iVar3,&u3,finswap);
          finother = finswap;
        }
        pa_local = (double *)finother[adxtail._4_4_ + -1];
      }
    }
  }
  return (double)pa_local;
}

Assistant:

REAL orient3dadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL permanent)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL det, errbound;

  INEXACT REAL bdxcdy1, cdxbdy1, cdxady1, adxcdy1, adxbdy1, bdxady1;
  REAL bdxcdy0, cdxbdy0, cdxady0, adxcdy0, adxbdy0, bdxady0;
  REAL bc[4], ca[4], ab[4];
  INEXACT REAL bc3, ca3, ab3;
  REAL adet[8], bdet[8], cdet[8];
  int alen, blen, clen;
  REAL abdet[16];
  int ablen;
  REAL *finnow, *finother, *finswap;
  REAL fin1[192], fin2[192];
  int finlength;


  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL adztail, bdztail, cdztail;
  INEXACT REAL at_blarge, at_clarge;
  INEXACT REAL bt_clarge, bt_alarge;
  INEXACT REAL ct_alarge, ct_blarge;
  REAL at_b[4], at_c[4], bt_c[4], bt_a[4], ct_a[4], ct_b[4];
  int at_blen, at_clen, bt_clen, bt_alen, ct_alen, ct_blen;
  INEXACT REAL bdxt_cdy1, cdxt_bdy1, cdxt_ady1;
  INEXACT REAL adxt_cdy1, adxt_bdy1, bdxt_ady1;
  REAL bdxt_cdy0, cdxt_bdy0, cdxt_ady0;
  REAL adxt_cdy0, adxt_bdy0, bdxt_ady0;
  INEXACT REAL bdyt_cdx1, cdyt_bdx1, cdyt_adx1;
  INEXACT REAL adyt_cdx1, adyt_bdx1, bdyt_adx1;
  REAL bdyt_cdx0, cdyt_bdx0, cdyt_adx0;
  REAL adyt_cdx0, adyt_bdx0, bdyt_adx0;
  REAL bct[8], cat[8], abt[8];
  int bctlen, catlen, abtlen;
  INEXACT REAL bdxt_cdyt1, cdxt_bdyt1, cdxt_adyt1;
  INEXACT REAL adxt_cdyt1, adxt_bdyt1, bdxt_adyt1;
  REAL bdxt_cdyt0, cdxt_bdyt0, cdxt_adyt0;
  REAL adxt_cdyt0, adxt_bdyt0, bdxt_adyt0;
  REAL u[4], v[12], w[16];
  INEXACT REAL u3;
  int vlength, wlength;
  REAL negate;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k;
  REAL _0;


  adx = (REAL) (pa[0] - pd[0]);
  bdx = (REAL) (pb[0] - pd[0]);
  cdx = (REAL) (pc[0] - pd[0]);
  ady = (REAL) (pa[1] - pd[1]);
  bdy = (REAL) (pb[1] - pd[1]);
  cdy = (REAL) (pc[1] - pd[1]);
  adz = (REAL) (pa[2] - pd[2]);
  bdz = (REAL) (pb[2] - pd[2]);
  cdz = (REAL) (pc[2] - pd[2]);

  Two_Product(bdx, cdy, bdxcdy1, bdxcdy0);
  Two_Product(cdx, bdy, cdxbdy1, cdxbdy0);
  Two_Two_Diff(bdxcdy1, bdxcdy0, cdxbdy1, cdxbdy0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;
  alen = scale_expansion_zeroelim(4, bc, adz, adet);

  Two_Product(cdx, ady, cdxady1, cdxady0);
  Two_Product(adx, cdy, adxcdy1, adxcdy0);
  Two_Two_Diff(cdxady1, cdxady0, adxcdy1, adxcdy0, ca3, ca[2], ca[1], ca[0]);
  ca[3] = ca3;
  blen = scale_expansion_zeroelim(4, ca, bdz, bdet);

  Two_Product(adx, bdy, adxbdy1, adxbdy0);
  Two_Product(bdx, ady, bdxady1, bdxady0);
  Two_Two_Diff(adxbdy1, adxbdy0, bdxady1, bdxady0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;
  clen = scale_expansion_zeroelim(4, ab, cdz, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, fin1);

  det = estimate(finlength, fin1);
  errbound = o3derrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pd[0], adx, adxtail);
  Two_Diff_Tail(pb[0], pd[0], bdx, bdxtail);
  Two_Diff_Tail(pc[0], pd[0], cdx, cdxtail);
  Two_Diff_Tail(pa[1], pd[1], ady, adytail);
  Two_Diff_Tail(pb[1], pd[1], bdy, bdytail);
  Two_Diff_Tail(pc[1], pd[1], cdy, cdytail);
  Two_Diff_Tail(pa[2], pd[2], adz, adztail);
  Two_Diff_Tail(pb[2], pd[2], bdz, bdztail);
  Two_Diff_Tail(pc[2], pd[2], cdz, cdztail);

  if ((adxtail == 0.0) && (bdxtail == 0.0) && (cdxtail == 0.0)
      && (adytail == 0.0) && (bdytail == 0.0) && (cdytail == 0.0)
      && (adztail == 0.0) && (bdztail == 0.0) && (cdztail == 0.0)) {
    return det;
  }

  errbound = o3derrboundC * permanent + resulterrbound * Absolute(det);
  det += (adz * ((bdx * cdytail + cdy * bdxtail)
                 - (bdy * cdxtail + cdx * bdytail))
          + adztail * (bdx * cdy - bdy * cdx))
       + (bdz * ((cdx * adytail + ady * cdxtail)
                 - (cdy * adxtail + adx * cdytail))
          + bdztail * (cdx * ady - cdy * adx))
       + (cdz * ((adx * bdytail + bdy * adxtail)
                 - (ady * bdxtail + bdx * adytail))
          + cdztail * (adx * bdy - ady * bdx));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  finnow = fin1;
  finother = fin2;

  if (adxtail == 0.0) {
    if (adytail == 0.0) {
      at_b[0] = 0.0;
      at_blen = 1;
      at_c[0] = 0.0;
      at_clen = 1;
    } else {
      negate = -adytail;
      Two_Product(negate, bdx, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      Two_Product(adytail, cdx, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    }
  } else {
    if (adytail == 0.0) {
      Two_Product(adxtail, bdy, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      negate = -adxtail;
      Two_Product(negate, cdy, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    } else {
      Two_Product(adxtail, bdy, adxt_bdy1, adxt_bdy0);
      Two_Product(adytail, bdx, adyt_bdx1, adyt_bdx0);
      Two_Two_Diff(adxt_bdy1, adxt_bdy0, adyt_bdx1, adyt_bdx0,
                   at_blarge, at_b[2], at_b[1], at_b[0]);
      at_b[3] = at_blarge;
      at_blen = 4;
      Two_Product(adytail, cdx, adyt_cdx1, adyt_cdx0);
      Two_Product(adxtail, cdy, adxt_cdy1, adxt_cdy0);
      Two_Two_Diff(adyt_cdx1, adyt_cdx0, adxt_cdy1, adxt_cdy0,
                   at_clarge, at_c[2], at_c[1], at_c[0]);
      at_c[3] = at_clarge;
      at_clen = 4;
    }
  }
  if (bdxtail == 0.0) {
    if (bdytail == 0.0) {
      bt_c[0] = 0.0;
      bt_clen = 1;
      bt_a[0] = 0.0;
      bt_alen = 1;
    } else {
      negate = -bdytail;
      Two_Product(negate, cdx, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      Two_Product(bdytail, adx, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    }
  } else {
    if (bdytail == 0.0) {
      Two_Product(bdxtail, cdy, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      negate = -bdxtail;
      Two_Product(negate, ady, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    } else {
      Two_Product(bdxtail, cdy, bdxt_cdy1, bdxt_cdy0);
      Two_Product(bdytail, cdx, bdyt_cdx1, bdyt_cdx0);
      Two_Two_Diff(bdxt_cdy1, bdxt_cdy0, bdyt_cdx1, bdyt_cdx0,
                   bt_clarge, bt_c[2], bt_c[1], bt_c[0]);
      bt_c[3] = bt_clarge;
      bt_clen = 4;
      Two_Product(bdytail, adx, bdyt_adx1, bdyt_adx0);
      Two_Product(bdxtail, ady, bdxt_ady1, bdxt_ady0);
      Two_Two_Diff(bdyt_adx1, bdyt_adx0, bdxt_ady1, bdxt_ady0,
                  bt_alarge, bt_a[2], bt_a[1], bt_a[0]);
      bt_a[3] = bt_alarge;
      bt_alen = 4;
    }
  }
  if (cdxtail == 0.0) {
    if (cdytail == 0.0) {
      ct_a[0] = 0.0;
      ct_alen = 1;
      ct_b[0] = 0.0;
      ct_blen = 1;
    } else {
      negate = -cdytail;
      Two_Product(negate, adx, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      Two_Product(cdytail, bdx, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    }
  } else {
    if (cdytail == 0.0) {
      Two_Product(cdxtail, ady, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      negate = -cdxtail;
      Two_Product(negate, bdy, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    } else {
      Two_Product(cdxtail, ady, cdxt_ady1, cdxt_ady0);
      Two_Product(cdytail, adx, cdyt_adx1, cdyt_adx0);
      Two_Two_Diff(cdxt_ady1, cdxt_ady0, cdyt_adx1, cdyt_adx0,
                   ct_alarge, ct_a[2], ct_a[1], ct_a[0]);
      ct_a[3] = ct_alarge;
      ct_alen = 4;
      Two_Product(cdytail, bdx, cdyt_bdx1, cdyt_bdx0);
      Two_Product(cdxtail, bdy, cdxt_bdy1, cdxt_bdy0);
      Two_Two_Diff(cdyt_bdx1, cdyt_bdx0, cdxt_bdy1, cdxt_bdy0,
                   ct_blarge, ct_b[2], ct_b[1], ct_b[0]);
      ct_b[3] = ct_blarge;
      ct_blen = 4;
    }
  }

  bctlen = fast_expansion_sum_zeroelim(bt_clen, bt_c, ct_blen, ct_b, bct);
  wlength = scale_expansion_zeroelim(bctlen, bct, adz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  catlen = fast_expansion_sum_zeroelim(ct_alen, ct_a, at_clen, at_c, cat);
  wlength = scale_expansion_zeroelim(catlen, cat, bdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  abtlen = fast_expansion_sum_zeroelim(at_blen, at_b, bt_alen, bt_a, abt);
  wlength = scale_expansion_zeroelim(abtlen, abt, cdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  if (adztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, bc, adztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ca, bdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ab, cdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  if (adxtail != 0.0) {
    if (bdytail != 0.0) {
      Two_Product(adxtail, bdytail, adxt_bdyt1, adxt_bdyt0);
      Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (cdytail != 0.0) {
      negate = -adxtail;
      Two_Product(negate, cdytail, adxt_cdyt1, adxt_cdyt0);
      Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (bdxtail != 0.0) {
    if (cdytail != 0.0) {
      Two_Product(bdxtail, cdytail, bdxt_cdyt1, bdxt_cdyt0);
      Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (adytail != 0.0) {
      negate = -bdxtail;
      Two_Product(negate, adytail, bdxt_adyt1, bdxt_adyt0);
      Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (cdxtail != 0.0) {
    if (adytail != 0.0) {
      Two_Product(cdxtail, adytail, cdxt_adyt1, cdxt_adyt0);
      Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (bdytail != 0.0) {
      negate = -cdxtail;
      Two_Product(negate, bdytail, cdxt_bdyt1, cdxt_bdyt0);
      Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }

  if (adztail != 0.0) {
    wlength = scale_expansion_zeroelim(bctlen, bct, adztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    wlength = scale_expansion_zeroelim(catlen, cat, bdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    wlength = scale_expansion_zeroelim(abtlen, abt, cdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  return finnow[finlength - 1];
}